

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall
SQLite::Database::Database
          (Database *this,string *aFilename,int aFlags,int aBusyTimeoutMs,string *aVfs)

{
  int ret;
  Exception *this_00;
  char *zVfs;
  Exception exception;
  
  this->mpSQLite = (sqlite3 *)0x0;
  std::__cxx11::string::string((string *)&this->mFilename,(string *)aFilename);
  zVfs = (char *)aVfs->_M_string_length;
  if (zVfs != (char *)0x0) {
    zVfs = (aVfs->_M_dataplus)._M_p;
  }
  ret = sqlite3_open_v2((aFilename->_M_dataplus)._M_p,&this->mpSQLite,aFlags,zVfs);
  if (ret == 0) {
    if (0 < aBusyTimeoutMs) {
      setBusyTimeout(this,aBusyTimeoutMs);
    }
    return;
  }
  Exception::Exception(&exception,this->mpSQLite,ret);
  sqlite3_close(this->mpSQLite);
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,&exception);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Database::Database(const std::string& aFilename,
                   const int          aFlags         /* = SQLite::OPEN_READONLY*/,
                   const int          aBusyTimeoutMs /* = 0 */,
                   const std::string& aVfs           /* = "" */) :
    mpSQLite(nullptr),
    mFilename(aFilename)
{
    const int ret = sqlite3_open_v2(aFilename.c_str(), &mpSQLite, aFlags, aVfs.empty() ? nullptr : aVfs.c_str());
    if (SQLITE_OK != ret)
    {
        const SQLite::Exception exception(mpSQLite, ret); // must create before closing
        sqlite3_close(mpSQLite); // close is required even in case of error on opening
        throw exception;
    }
    if (aBusyTimeoutMs > 0)
    {
        setBusyTimeout(aBusyTimeoutMs);
    }
}